

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24e5871::ObmcVarianceTest_DISABLED_Speed_Test::TestBody
          (ObmcVarianceTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int i;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint tst_sse;
  uint ref_sse;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  uint8_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint uStack_240a8;
  uint uStack_240a4;
  timeval tStack_240a0;
  timeval tStack_24090;
  timeval tStack_24080;
  timeval tStack_24070;
  uchar auStack_24060 [16384];
  uint32_t auStack_20060 [16384];
  int aiStack_10060 [16396];
  
  this_00 = &(this->super_ObmcVarianceTest).
             super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
             .rng_;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x81);
  lVar6 = 0;
  do {
    uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
    auStack_24060[lVar6] = (uchar)(uVar2 >> 0x17);
    uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
    uVar3 = testing::internal::Random::Generate(&this_00->random_,0x1001);
    aiStack_10060[lVar6] = uVar3 * (uVar2 >> 0x17 & 0xff);
    uVar2 = testing::internal::Random::Generate(&this_00->random_,0x1001);
    auStack_20060[lVar6] = uVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x4000);
  gettimeofday(&tStack_24080,(__timezone_ptr_t)0x0);
  iVar5 = 1000000;
  do {
    (*(this->super_ObmcVarianceTest).
      super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
      .params_.ref_func)(auStack_24060,uVar1,aiStack_10060,(int *)auStack_20060,&uStack_240a4);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  gettimeofday(&tStack_24070,(__timezone_ptr_t)0x0);
  gettimeofday(&tStack_240a0,(__timezone_ptr_t)0x0);
  iVar5 = 1000000;
  do {
    (*(this->super_ObmcVarianceTest).
      super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
      .params_.tst_func)(auStack_24060,uVar1,aiStack_10060,(int *)auStack_20060,&uStack_240a8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar6 = tStack_24070.tv_usec - tStack_24080.tv_usec;
  iVar5 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar5 = (int)lVar6;
  }
  uVar7 = iVar5 + ((int)(lVar6 >> 0x3f) + ((int)tStack_24070.tv_sec - (int)tStack_24080.tv_sec)) *
                  1000000;
  gettimeofday(&tStack_24090,(__timezone_ptr_t)0x0);
  lVar6 = tStack_24090.tv_usec - tStack_240a0.tv_usec;
  iVar5 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar5 = (int)lVar6;
  }
  uVar4 = iVar5 + ((int)(lVar6 >> 0x3f) + ((int)tStack_24090.tv_sec - (int)tStack_240a0.tv_sec)) *
                  1000000;
  printf("c_time=%d \t simd_time=%d \t gain=%f \n",(double)(int)uVar7 / (double)(int)uVar4,
         (ulong)uVar7,(ulong)uVar4);
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, DISABLED_Speed) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  const int pre_stride = this->rng_(MAX_SB_SIZE + 1);

  for (int i = 0; i < MAX_SB_SQUARE; ++i) {
    pre[i] = this->rng_.Rand8();
    wsrc[i] = this->rng_.Rand8() * this->rng_(kMaskMax * kMaskMax + 1);
    mask[i] = this->rng_(kMaskMax * kMaskMax + 1);
  }

  const int num_loops = 1000000;
  unsigned int ref_sse, tst_sse;
  aom_usec_timer ref_timer, test_timer;

  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
  }
  aom_usec_timer_mark(&ref_timer);
  const int elapsed_time_c =
      static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse);
  }
  aom_usec_timer_mark(&test_timer);
  const int elapsed_time_simd =
      static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf("c_time=%d \t simd_time=%d \t gain=%f \n", elapsed_time_c,
         elapsed_time_simd,
         static_cast<double>(elapsed_time_c) / elapsed_time_simd);
}